

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O0

void CECoordinates::Galactic2ICRS
               (double glon,double glat,double *ra,double *dec,CEAngleType *angle_type)

{
  int *in_RDX;
  double *in_RSI;
  double *in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  undefined8 local_10;
  undefined8 local_8;
  
  local_10 = in_XMM1_Qa;
  local_8 = in_XMM0_Qa;
  if (*in_RDX == 0) {
    local_8 = in_XMM0_Qa * 0.017453292519943295;
    local_10 = in_XMM1_Qa * 0.017453292519943295;
  }
  iauG2icrs(local_8,local_10,in_RDI,in_RSI);
  if (*in_RDX == 0) {
    *in_RDI = *in_RDI * 57.29577951308232;
    *in_RSI = *in_RSI * 57.29577951308232;
  }
  return;
}

Assistant:

void CECoordinates::Galactic2ICRS(double glon, double glat, 
                                  double *ra, double *dec,
                                  const CEAngleType& angle_type)
{
    // Check for degrees
    if (angle_type == CEAngleType::DEGREES) {
        glon *= DD2R ;
        glat *= DD2R ;
    }
    
    // Do the Galactic -> ICRS converstion
    iauG2icrs(glon, glat, ra, dec) ;
    
    // Now make sure to return the coordinates in the correct format
    if (angle_type == CEAngleType::DEGREES) {
        *ra  *= DR2D ;
        *dec *= DR2D ;
    }
}